

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O2

void __thiscall
adios2::transport::FileFStream::OpenChain
          (FileFStream *this,string *name,Mode openMode,Comm *chainComm,bool async,bool directio)

{
  int iVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result<void> *p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  _Ios_Openmode _Var5;
  string *psVar6;
  undefined7 in_register_00000081;
  __allocator_type __a2;
  string local_1b8;
  int token;
  string *local_190;
  Status local_188;
  __allocator_type __a2_1;
  thread local_160;
  undefined8 local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_150 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  Comm local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  token = 1;
  __rhs = &(this->super_Transport).m_Name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  iVar1 = helper::Comm::Rank(chainComm);
  psVar6 = (string *)CONCAT71(in_register_00000081,async);
  if (0 < iVar1) {
    local_190 = (string *)
                CONCAT44(local_190._4_4_,(int)(string *)CONCAT71(in_register_00000081,async));
    iVar1 = helper::Comm::Rank(chainComm);
    std::__cxx11::string::string
              ((string *)&local_1b8,"Chain token in FileFStream::OpenChain",(allocator *)&local_158)
    ;
    helper::Comm::Recv<int>(&local_188,chainComm,&token,1,iVar1 + -1,0,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    psVar6 = local_190;
  }
  (this->super_Transport).m_OpenMode = openMode;
  _Var5 = (_Ios_Openmode)name;
  if (openMode == Append) {
    std::__cxx11::string::string((string *)&local_90,"open",(allocator *)&local_1b8);
    Transport::ProfilerStart(&this->super_Transport,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::fstream::open((string *)&this->m_FileStream,_Var5);
    std::ostream::seekp((long)&this->field_0x100,_S_beg);
    std::__cxx11::string::string((string *)&local_b0,"open",(allocator *)&local_1b8);
    psVar6 = &local_b0;
LAB_005fb16b:
    Transport::ProfilerStop(&this->super_Transport,psVar6);
  }
  else {
    if (openMode == Read) {
      std::__cxx11::string::string((string *)&local_d0,"open",(allocator *)&local_1b8);
      Transport::ProfilerStart(&this->super_Transport,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::fstream::open((string *)&this->m_FileStream,_Var5);
      std::__cxx11::string::string((string *)&local_f0,"open",(allocator *)&local_1b8);
      psVar6 = &local_f0;
      goto LAB_005fb16b;
    }
    if (openMode == Write) {
      if ((char)psVar6 != '\0') {
        iVar1 = helper::Comm::Size(chainComm);
        if (iVar1 == 1) {
          this->m_IsOpening = true;
          local_188._0_8_ = (element_type *)0x0;
          local_188.Count = 0;
          local_190 = name;
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
          p_Var3->_M_use_count = 1;
          p_Var3->_M_weak_count = 1;
          p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_008238e8;
          p_Var3[1]._M_use_count = 0;
          p_Var3[1]._M_weak_count = 0;
          *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0;
          *(undefined1 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
          p_Var3[2]._M_use_count = 0;
          local_1b8._M_dataplus._M_p = (pointer)&__a2;
          p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var3[3]._M_use_count = 0;
          p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00823938;
          local_1b8._M_string_length = (size_type)p_Var3;
          p_Var4 = (_Result<void> *)operator_new(0x10);
          *(undefined8 *)p_Var4 = 0;
          *(undefined8 *)&p_Var4->field_0x8 = 0;
          std::__future_base::_Result<void>::_Result(p_Var4);
          p_Var3[4]._vptr__Sp_counted_base = (_func_int **)p_Var4;
          std::__cxx11::string::string((string *)&p_Var3[4]._M_use_count,(string *)local_190);
          *(FileFStream **)&p_Var3[6]._M_use_count = this;
          local_160._M_id._M_thread = (id)0;
          ___a2_1 = (long *)operator_new(0x20);
          *___a2_1 = (long)&PTR___State_00823990;
          ___a2_1[1] = (long)(p_Var3 + 1);
          ___a2_1[2] = (long)std::__future_base::
                             _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:100:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
                             ::_M_run;
          ___a2_1[3] = 0;
          std::thread::_M_start_thread(&local_160,&__a2_1,0);
          local_140 = __rhs;
          if (___a2_1 != (long *)0x0) {
            (**(code **)(*___a2_1 + 8))();
          }
          std::thread::operator=((thread *)(p_Var3 + 3),&local_160);
          std::thread::~thread(&local_160);
          local_1b8._M_string_length = 0;
          std::
          __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:100:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:100:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
          ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileFStream_cpp:100:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileFStream_cpp:100:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                              *)&local_1b8);
          local_158 = 0;
          a_Stack_150[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1b8._M_dataplus._M_p = (pointer)local_188._0_8_;
          local_1b8._M_string_length = local_188.Count;
          local_188._0_8_ = p_Var3 + 1;
          local_188.Count = (size_t)p_Var3;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_150);
          __rhs = local_140;
          if ((element_type *)local_188._0_8_ == (element_type *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
            p_Var3->_M_use_count = 1;
            p_Var3->_M_weak_count = 1;
            p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_008239d0;
            p_Var3[1]._M_use_count = 0;
            p_Var3[1]._M_weak_count = 0;
            local_1b8._M_dataplus._M_p = (pointer)&__a2_1;
            *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0;
            *(undefined1 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
            p_Var3[2]._M_use_count = 0;
            p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00823a20;
            local_1b8._M_string_length = (size_type)p_Var3;
            p_Var4 = (_Result<void> *)operator_new(0x10);
            *(undefined8 *)p_Var4 = 0;
            *(undefined8 *)&p_Var4->field_0x8 = 0;
            std::__future_base::_Result<void>::_Result(p_Var4);
            p_Var3[3]._vptr__Sp_counted_base = (_func_int **)p_Var4;
            std::__cxx11::string::string((string *)&p_Var3[3]._M_use_count,(string *)local_190);
            *(FileFStream **)&p_Var3[5]._M_use_count = this;
            local_1b8._M_string_length = 0;
            std::
            __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:100:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:100:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
            ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileFStream_cpp:100:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FileFStream_cpp:100:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                                *)&local_1b8);
            local_158 = 0;
            a_Stack_150[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_1b8._M_dataplus._M_p = (pointer)local_188._0_8_;
            local_1b8._M_string_length = local_188.Count;
            local_188._0_8_ = p_Var3 + 1;
            local_188.Count = (size_t)p_Var3;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_150);
          }
          std::__basic_future<void>::__basic_future
                    ((__basic_future<void> *)&local_1b8,(__state_type *)&local_188);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_188.Count);
          std::future<void>::operator=(&this->m_OpenFuture,(future<void> *)&local_1b8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
          goto LAB_005fb17e;
        }
      }
      std::__cxx11::string::string((string *)&local_50,"open",(allocator *)&local_1b8);
      Transport::ProfilerStart(&this->super_Transport,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      helper::Comm::Rank(chainComm);
      std::fstream::open((string *)&this->m_FileStream,_Var5);
      std::__cxx11::string::string((string *)&local_70,"open",(allocator *)&local_1b8);
      psVar6 = &local_70;
      goto LAB_005fb16b;
    }
    std::operator+(&local_1b8,"unknown open mode for file ",__rhs);
    std::operator+(&local_110,&local_1b8,", in call to stream open");
    CheckFile(this,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    psVar6 = &local_1b8;
  }
  std::__cxx11::string::~string((string *)psVar6);
LAB_005fb17e:
  if (this->m_IsOpening == false) {
    std::operator+(&local_1b8,"couldn\'t open file ",__rhs);
    std::operator+(&local_130,&local_1b8,
                   ", check permissions or path existence, in call to fstream open");
    CheckFile(this,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1b8);
    (this->super_Transport).m_IsOpen = true;
  }
  iVar1 = helper::Comm::Rank(chainComm);
  iVar2 = helper::Comm::Size(chainComm);
  if (iVar1 < iVar2 + -1) {
    iVar1 = helper::Comm::Rank(chainComm);
    std::__cxx11::string::string
              ((string *)&local_1b8,"Sending Chain token in FileFStream::OpenChain",
               (allocator *)&local_188);
    helper::Comm::Isend<int>(&local_138,(int *)chainComm,(size_t)&token,1,iVar1 + 1,(string *)0x0);
    helper::Comm::Req::~Req((Req *)&local_138);
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  return;
}

Assistant:

void FileFStream::OpenChain(const std::string &name, Mode openMode, const helper::Comm &chainComm,
                            const bool async, const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> void {
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::out | std::fstream::binary | std::fstream::trunc);
        ProfilerStop("open");
    };

    int token = 1;
    m_Name = name;
    CheckName();

    if (chainComm.Rank() > 0)
    {
        chainComm.Recv(&token, 1, chainComm.Rank() - 1, 0, "Chain token in FileFStream::OpenChain");
    }

    m_OpenMode = openMode;
    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async && chainComm.Size() == 1)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            ProfilerStart("open");
            if (chainComm.Rank() == 0)
            {
                m_FileStream.open(name,
                                  std::fstream::out | std::fstream::binary | std::fstream::trunc);
            }
            else
            {
                m_FileStream.open(name, std::fstream::out | std::fstream::binary);
            }
            ProfilerStop("open");
        }
        break;

    case Mode::Append:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::out | std::fstream::binary);
        m_FileStream.seekp(0, std::ios_base::end);
        ProfilerStop("open");
        break;

    case Mode::Read:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::binary);
        ProfilerStop("open");
        break;

    default:
        CheckFile("unknown open mode for file " + m_Name + ", in call to stream open");
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to fstream open");
        m_IsOpen = true;
    }

    if (chainComm.Rank() < chainComm.Size() - 1)
    {
        chainComm.Isend(&token, 1, chainComm.Rank() + 1, 0,
                        "Sending Chain token in FileFStream::OpenChain");
    }
}